

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pbkdf2.c
# Opt level: O0

OSSL_PARAM * kdf_pbkdf2_settable_ctx_params(void *ctx,void *p_ctx)

{
  void *p_ctx_local;
  void *ctx_local;
  
  return kdf_pbkdf2_settable_ctx_params::known_settable_ctx_params;
}

Assistant:

static const OSSL_PARAM *kdf_pbkdf2_settable_ctx_params(ossl_unused void *ctx,
                                                        ossl_unused void *p_ctx)
{
    static const OSSL_PARAM known_settable_ctx_params[] = {
        OSSL_PARAM_utf8_string(OSSL_KDF_PARAM_PROPERTIES, NULL, 0),
        OSSL_PARAM_utf8_string(OSSL_KDF_PARAM_DIGEST, NULL, 0),
        OSSL_PARAM_octet_string(OSSL_KDF_PARAM_PASSWORD, NULL, 0),
        OSSL_PARAM_octet_string(OSSL_KDF_PARAM_SALT, NULL, 0),
        OSSL_PARAM_uint64(OSSL_KDF_PARAM_ITER, NULL),
        OSSL_PARAM_int(OSSL_KDF_PARAM_PKCS5, NULL),
        OSSL_PARAM_END
    };
    return known_settable_ctx_params;
}